

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_value_string(jx9_value *pVal,char *zString,int nLen)

{
  char *pcVar1;
  int in_EAX;
  sxi32 sVar2;
  char *pcVar3;
  
  if ((pVal->iFlags & 1) == 0) {
    jx9MemObjRelease(pVal);
    in_EAX = (pVal->iFlags & 0xfffffe90U) + 1;
    pVal->iFlags = in_EAX;
  }
  if (zString == (char *)0x0) {
    return in_EAX;
  }
  if (nLen < 0) {
    pcVar3 = zString;
    if (*zString != '\0') {
      pcVar1 = zString + 2;
      do {
        pcVar3 = pcVar1;
        if (pcVar3[-1] == '\0') {
          pcVar3 = pcVar3 + -1;
          goto LAB_0010c9b0;
        }
        if (*pcVar3 == '\0') goto LAB_0010c9b0;
        if (pcVar3[1] == '\0') {
          pcVar3 = pcVar3 + 1;
          goto LAB_0010c9b0;
        }
        pcVar1 = pcVar3 + 4;
      } while (pcVar3[2] != '\0');
      pcVar3 = pcVar3 + 2;
    }
LAB_0010c9b0:
    nLen = (int)pcVar3 - (int)zString;
  }
  sVar2 = SyBlobAppend(&pVal->sBlob,zString,nLen);
  return sVar2;
}

Assistant:

JX9_PRIVATE int jx9_value_string(jx9_value *pVal, const char *zString, int nLen)
{
	if((pVal->iFlags & MEMOBJ_STRING) == 0 ){
		/* Invalidate any prior representation */
		jx9MemObjRelease(pVal);
		MemObjSetType(pVal, MEMOBJ_STRING);
	}
	if( zString ){
		if( nLen < 0 ){
			/* Compute length automatically */
			nLen = (int)SyStrlen(zString);
		}
		SyBlobAppend(&pVal->sBlob, (const void *)zString, (sxu32)nLen);
	}
	return JX9_OK;
}